

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  string local_1e8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1c8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1a8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_188;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_128;
  Resources res;
  
  Environment::Environment(&env,(Context *)this,4);
  GraphicsPipeline::Resources::Resources(&res,&env,extraout_RDX);
  GraphicsPipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1c8,&env,&res,param_4);
  local_1e8.field_2._M_allocated_capacity = (size_type)local_1c8.m_data.deleter.m_device;
  local_1e8.field_2._8_8_ = local_1c8.m_data.deleter.m_allocator;
  local_1e8._M_dataplus._M_p = (pointer)local_1c8.m_data.object.m_internal;
  local_1e8._M_string_length = (size_type)local_1c8.m_data.deleter.m_deviceIface;
  local_1c8.m_data.object.m_internal = 0;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1c8);
  GraphicsPipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1a8,&env,&res,param_4);
  local_1c8.m_data.deleter.m_device = local_1a8.m_data.deleter.m_device;
  local_1c8.m_data.deleter.m_allocator = local_1a8.m_data.deleter.m_allocator;
  local_1c8.m_data.object.m_internal = local_1a8.m_data.object.m_internal;
  local_1c8.m_data.deleter.m_deviceIface = local_1a8.m_data.deleter.m_deviceIface;
  local_1a8.m_data.object.m_internal = 0;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1a8);
  GraphicsPipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_188,&env,&res,param_4);
  local_1a8.m_data.deleter.m_device = local_188.m_data.deleter.m_device;
  local_1a8.m_data.deleter.m_allocator = local_188.m_data.deleter.m_allocator;
  local_1a8.m_data.object.m_internal = local_188.m_data.object.m_internal;
  local_1a8.m_data.deleter.m_deviceIface = local_188.m_data.deleter.m_deviceIface;
  local_188.m_data.object.m_internal = 0;
  local_188.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_188.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_188);
  GraphicsPipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_128,&env,&res,param_4);
  local_188.m_data.deleter.m_device = local_128.m_data.deleter.m_device;
  local_188.m_data.deleter.m_allocator = local_128.m_data.deleter.m_allocator;
  local_188.m_data.object.m_internal = local_128.m_data.object.m_internal;
  local_188.m_data.deleter.m_deviceIface = local_128.m_data.deleter.m_deviceIface;
  local_128.m_data.object.m_internal = 0;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_128.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_188);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Ok",(allocator<char> *)&local_1c8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  GraphicsPipeline::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}